

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::Module::GetConstants
          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,Module *this)

{
  bool bVar1;
  Op opcode;
  Instruction *local_48;
  Instruction *local_40;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  InstructionList *__range2;
  Module *this_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *const_insts;
  
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            (__return_storage_ptr__);
  InstructionList::begin((InstructionList *)&__end2);
  InstructionList::end((InstructionList *)&inst);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1) {
    local_40 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    opcode = opt::Instruction::opcode(local_40);
    bVar1 = IsConstantInst(opcode);
    if (bVar1) {
      local_48 = local_40;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(__return_storage_ptr__,&local_48);
    }
    InstructionList::iterator::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Instruction*> Module::GetConstants() {
  std::vector<Instruction*> const_insts;
  for (auto& inst : types_values_) {
    if (IsConstantInst(inst.opcode())) const_insts.push_back(&inst);
  }
  return const_insts;
}